

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O0

void p_socket_set_keepalive(PSocket *socket,pboolean keepalive)

{
  int iVar1;
  uint local_18;
  int local_14;
  pint value;
  pboolean keepalive_local;
  PSocket *socket_local;
  
  if ((socket != (PSocket *)0x0) && ((bool)((byte)socket->field_0x18 >> 1 & 1) != (keepalive != 0)))
  {
    local_18 = (uint)(keepalive != 0);
    local_14 = keepalive;
    _value = socket;
    iVar1 = setsockopt(socket->fd,1,9,&local_18,4);
    if (iVar1 < 0) {
      printf("** Warning: %s **\n",
             "PSocket::p_socket_set_keepalive: setsockopt() with SO_KEEPALIVE failed");
    }
    else {
      _value->field_0x18 = _value->field_0x18 & 0xfd | (local_14 != 0) << 1;
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_socket_set_keepalive (PSocket		*socket,
			pboolean	keepalive)
{
#ifdef P_OS_WIN
	pchar value;
#else
	pint value;
#endif

	if (P_UNLIKELY (socket == NULL))
		return;

	if (socket->keepalive == (puint) !!keepalive)
		return;

#ifdef P_OS_WIN
	value = !! (pchar) keepalive;
#else
	value = !! (pint) keepalive;
#endif
	if (setsockopt (socket->fd, SOL_SOCKET, SO_KEEPALIVE, &value, sizeof (value)) < 0) {
		P_WARNING ("PSocket::p_socket_set_keepalive: setsockopt() with SO_KEEPALIVE failed");
		return;
	}

	socket->keepalive = !! (pint) keepalive;
}